

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadStringArray
          (CrateReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *d)

{
  StreamReader *pSVar1;
  uint64_t uVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  size_t nbytes;
  size_t __n;
  uint64_t n;
  optional<tinyusdz::Token> v;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> ivalue;
  ostringstream ss_e;
  uint64_t local_268;
  optional<tinyusdz::Token> local_260;
  long *local_238;
  long local_230;
  long local_228 [2];
  string *local_218;
  long local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f0;
  ulong local_1e8;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> local_1e0;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = 0;
  bVar3 = StreamReader::read8(this->_sr,&local_268);
  if (bVar3) {
    if ((this->_config).maxArrayElements < local_268) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x3b6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar8 = "Too many array elements.";
      lVar6 = 0x18;
    }
    else {
      uVar5 = local_268 * 4 + this->_memoryUsage;
      this->_memoryUsage = uVar5;
      if (uVar5 <= (this->_config).maxMemoryBudget) {
        ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::vector
                  (&local_1e0,local_268,(allocator_type *)local_1a8);
        pSVar1 = this->_sr;
        uVar2 = pSVar1->idx_;
        __n = pSVar1->length_ - uVar2;
        if (uVar2 + local_268 * 4 <= pSVar1->length_) {
          __n = local_268 << 2;
        }
        local_1f0 = d;
        if (__n - 1 < local_268 << 2) {
          memcpy(local_1e0.
                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                 ._M_impl.super__Vector_impl_data._M_start,pSVar1->binary_ + uVar2,__n);
          pSVar1->idx_ = pSVar1->idx_ + __n;
          if (__n == 0) goto LAB_001c2d44;
          uVar5 = local_268 * 8 + this->_memoryUsage;
          this->_memoryUsage = uVar5;
          if ((this->_config).maxMemoryBudget < uVar5) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"operator()",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x3c5);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            pcVar8 = "Reached to max memory budget.";
            lVar6 = 0x1d;
            goto LAB_001c2de5;
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_208,local_268);
          bVar3 = local_268 == 0;
          if (!bVar3) {
            local_218 = &this->_err;
            lVar6 = 0;
            bVar3 = false;
            uVar5 = 0;
            do {
              GetStringToken(&local_260,this,
                             (Index)local_1e0.
                                    super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar5].value);
              if (local_260.has_value_ == true) {
                local_238 = local_228;
                local_210 = lVar6;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_238,local_260.contained.data.__align,
                           (undefined1 *)
                           (local_260.contained._8_8_ + (long)local_260.contained.data._0_8_));
                local_1e8 = (this->_config).maxMemoryBudget;
                uVar7 = this->_memoryUsage + local_230;
                this->_memoryUsage = uVar7;
                if (local_1e8 < uVar7) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[Crate]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"operator()",10);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x3ca);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append((char *)local_218,(ulong)local_1c8);
                  if (local_1c8 != local_1b8) {
                    operator_delete(local_1c8,local_1b8[0] + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
                  ::std::ios_base::~ios_base(local_138);
                }
                else {
                  ::std::__cxx11::string::_M_assign
                            ((string *)
                             ((long)&((local_208.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + local_210));
                }
                if (local_238 != local_228) {
                  operator_delete(local_238,local_228[0] + 1);
                }
                lVar6 = local_210;
                if (local_1e8 < uVar7) {
                  if ((local_260.has_value_ == true) &&
                     (local_260.contained.data.__align !=
                      (anon_struct_8_0_00000001_for___align)((long)&local_260.contained + 0x10))) {
                    operator_delete((void *)local_260.contained.data._0_8_,
                                    local_260.contained._16_8_ + 1);
                  }
                  break;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"operator()",10);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x3cd);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Invalid StringIndex.",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)local_218,(ulong)local_238);
                if (local_238 != local_228) {
                  operator_delete(local_238,local_228[0] + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
                ::std::ios_base::~ios_base(local_138);
              }
              if ((local_260.has_value_ == true) &&
                 (local_260.contained.data.__align !=
                  (anon_struct_8_0_00000001_for___align)((long)&local_260.contained + 0x10))) {
                operator_delete((void *)local_260.contained.data._0_8_,
                                local_260.contained._16_8_ + 1);
              }
              uVar5 = uVar5 + 1;
              lVar6 = lVar6 + 0x20;
              bVar3 = uVar5 >= local_268;
            } while (uVar5 < local_268);
          }
        }
        else {
LAB_001c2d44:
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10)
          ;
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x3c0);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar8 = "Failed to read STRING_VECTOR data.";
          lVar6 = 0x22;
LAB_001c2de5:
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar6);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append
                    ((char *)&this->_err,CONCAT71(local_260._1_7_,local_260.has_value_));
          if ((void *)CONCAT71(local_260._1_7_,local_260.has_value_) !=
              (void *)((long)&local_260.contained + 8)) {
            operator_delete((void *)CONCAT71(local_260._1_7_,local_260.has_value_),
                            local_260.contained._8_8_ + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
          ::std::ios_base::~ios_base(local_138);
          bVar3 = false;
        }
        d = local_1f0;
        if (local_1e0.
            super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e0.
                          super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e0.
                                super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e0.
                                super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          d = local_1f0;
        }
        goto LAB_001c2ae2;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x3b9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar8 = "Reached to max memory budget.";
      lVar6 = 0x1d;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator()",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x3b1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar8 = "Failed to read the number of array elements.";
    lVar6 = 0x2c;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append
            ((char *)&this->_err,CONCAT71(local_260._1_7_,local_260.has_value_));
  if ((void *)CONCAT71(local_260._1_7_,local_260.has_value_) !=
      (void *)((long)&local_260.contained + 8)) {
    operator_delete((void *)CONCAT71(local_260._1_7_,local_260.has_value_),
                    local_260.contained._8_8_ + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  bVar3 = false;
LAB_001c2ae2:
  if (bVar3) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(d,&local_208);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  return bVar3;
}

Assistant:

bool CrateReader::ReadStringArray(std::vector<std::string> *d) {
  // array data is not compressed
  auto ReadFn = [this](std::vector<std::string> &result) -> bool {
    uint64_t n{0};
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    if (n > _config.maxArrayElements) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      PUSH_ERROR("Failed to read STRING_VECTOR data.");
      return false;
    }

    // reconstruct
    CHECK_MEMORY_USAGE(size_t(n) * sizeof(void *));
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto v = GetStringToken(ivalue[i])) {
        std::string s = v.value().str();
        CHECK_MEMORY_USAGE(s.size());
        result[i] = s;
      } else {
        PUSH_ERROR("Invalid StringIndex.");
      }
    }

    return true;
  };

  std::vector<std::string> items;
  if (!ReadFn(items)) {
    return false;
  }

  (*d) = items;

  return true;
}